

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O3

void __thiscall
ktxValidator::logger::addIssue<int,int>
          (logger *this,severity severity,issue *issue,int args,int args_1)

{
  bool bVar1;
  ostream *poVar2;
  long *plVar3;
  fatal *this_00;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  pointer_____offset_0x10___ *ppuVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  string message;
  stringstream oss;
  int local_200;
  long local_1f8;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  ulong local_1c8;
  long local_1c0;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  if (this->quiet == true) {
    if (severity == eWarning) {
      this->warningCount = this->warningCount + 1;
      return;
    }
    if (severity == eError) {
      this->errorCount = this->errorCount + 1;
      return;
    }
  }
  else {
    if (this->headerWritten == false) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Issues in: ",0xb);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(this->nameOfFileBeingValidated)._M_dataplus._M_p,
                          (this->nameOfFileBeingValidated)._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      this->headerWritten = true;
    }
    if (this->maxIssues <= this->warningCount + this->errorCount) {
      this_00 = (fatal *)__cxa_allocate_exception(0x10);
      max_issues_exceeded::max_issues_exceeded((max_issues_exceeded *)this_00);
      ppuVar8 = &max_issues_exceeded::typeinfo;
      goto LAB_0011b873;
    }
    iVar4 = 4;
    do {
      std::ostream::put(-0x38);
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    if (severity == eWarning) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"WARNING: ",9);
      this->warningCount = this->warningCount + 1;
      lVar7 = 0xd;
LAB_0011b632:
      bVar1 = true;
    }
    else {
      if (severity == eError) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ERROR: ",7);
        this->errorCount = this->errorCount + 1;
LAB_0011b609:
        lVar7 = 0xb;
        goto LAB_0011b632;
      }
      bVar1 = false;
      lVar7 = 0;
      if (severity == eFatal) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FATAL: ",7);
        goto LAB_0011b609;
      }
    }
    std::__cxx11::stringstream::stringstream(local_1b8);
    sprintf<int,int>((stringstream *)local_1b8,&issue->message,args,args_1);
    std::__cxx11::stringbuf::str();
    uVar6 = (uint)lVar7;
    uVar5 = 0;
    local_1c0 = lVar7;
    if (0x50 < (ulong)(lVar7 + local_1e0)) {
      local_1f8 = local_1e0;
      local_1c8 = (ulong)(0x51 - uVar6);
      local_200 = 0;
      uVar9 = 0;
      do {
        uVar5 = (int)local_1c8 + uVar9;
        uVar10 = 0x50 - uVar6;
        do {
          uVar11 = uVar5 - 2;
          uVar5 = uVar5 - 1;
          uVar10 = uVar10 - 1;
        } while (*(char *)((long)local_1e8 + (ulong)uVar11) != ' ');
        if (local_200 != 0 && bVar1) {
          uVar11 = 0;
          do {
            std::ostream::put(-0x38);
            uVar11 = uVar11 + 1;
          } while (uVar11 < uVar6);
        }
        plVar3 = (long *)std::ostream::write((char *)&std::cout,(ulong)uVar9 + (long)local_1e8);
        std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
        std::ostream::put((char)plVar3);
        std::ostream::flush();
        local_1f8 = local_1f8 - (ulong)uVar10;
        local_200 = local_200 + 1;
        uVar9 = uVar5;
      } while (0x50 < (ulong)(local_1f8 + local_1c0));
      if (local_200 != 0) {
        uVar6 = 0xffffffff;
        do {
          std::ostream::put(-0x38);
          uVar6 = uVar6 + 1;
        } while (uVar6 < 3);
      }
    }
    std::ostream::write((char *)&std::cout,(ulong)uVar5 + (long)local_1e8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (severity != eFatal) {
    return;
  }
  this_00 = (fatal *)__cxa_allocate_exception(0x10);
  fatal::fatal(this_00);
  ppuVar8 = &fatal::typeinfo;
LAB_0011b873:
  __cxa_throw(this_00,ppuVar8,std::runtime_error::~runtime_error);
}

Assistant:

void
ktxValidator::logger::addIssue(severity severity, issue issue, Args ... args)
{
    if (quiet) {
        switch (severity) {
          case eError:
            errorCount++;
            break;
          case eFatal:
            break;
          case eWarning:
            warningCount++;
            break;
        }
    } else {
        if (!headerWritten) {
            cout << "Issues in: " << nameOfFileBeingValidated << std::endl;
            headerWritten = true;
        }
        const uint32_t baseIndent = 4;
        uint32_t indent = 0;
        if ((errorCount + warningCount ) < maxIssues) {
            for (uint32_t j = 0; j < baseIndent; j++)
              cout.put(' ');
            switch (severity) {
              case eError:
                cout << "ERROR: ";
                indent = baseIndent + 7;
                errorCount++;
                break;
              case eFatal:
                cout << "FATAL: ";
                indent = baseIndent + 7;
                break;
              case eWarning:
                cout << "WARNING: ";
                indent = baseIndent + 9;
                warningCount++;
                break;
            }
            //fprintf(stdout, issue.message.c_str(), args...);
            std::stringstream oss;
            sprintf(oss, issue.message, args...);
            // Wrap lines on spaces.
            std::string message = oss.str();
            size_t nchars = message.size();
            uint32_t line = 0;
            uint32_t lsi = 0;  // line start index.
            uint32_t lei; // line end index
            while (nchars + indent > 80) {
                uint32_t ll; // line length
                lei = lsi + 79 - indent;
                while (message[lei] != ' ') lei--;
                ll = lei - lsi;
                for (uint32_t j = 0; j < (line ? indent : 0); j++) {
                    cout.put(' ');
                }
                cout.write(&message[lsi], ll) << std::endl;
                lsi = lei + 1; // +1 to skip the space
                nchars -= ll;
                line++;
            }
            for (uint32_t j = 0; j < (line ? baseIndent : 0); j++) {
                cout.put(' ');
            }
            cout.write(&message[lsi], nchars);
            cout << std::endl;
        } else {
            throw max_issues_exceeded();
        }
    }
    if (severity == eFatal)
        throw fatal();
}